

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

void cuddSlowTableGrowth(DdManager *unique)

{
  int *piVar1;
  int iVar2;
  DdSubtable *pDVar3;
  long lVar4;
  
  unique->maxCacheHard = unique->cacheSlots - 1;
  unique->cacheSlack = ~unique->cacheSlots;
  iVar2 = unique->size;
  if (0 < (long)iVar2) {
    pDVar3 = unique->subtables;
    lVar4 = 0;
    do {
      piVar1 = (int *)((long)&pDVar3->maxKeys + lVar4);
      *piVar1 = *piVar1 << 2;
      lVar4 = lVar4 + 0x38;
    } while ((long)iVar2 * 0x38 - lVar4 != 0);
  }
  unique->gcFrac = 0.2;
  unique->minDead = (uint)(long)((double)unique->slots * 0.2);
  cuddShrinkDeathRow(unique);
  fwrite("Slowing down table growth: ",0x1b,1,(FILE *)unique->err);
  fprintf((FILE *)unique->err,"GC fraction = %.2f\t",unique->gcFrac);
  fprintf((FILE *)unique->err,"minDead = %u\n",(ulong)unique->minDead);
  return;
}

Assistant:

void
cuddSlowTableGrowth(
  DdManager *unique)
{
    int i;

    unique->maxCacheHard = unique->cacheSlots - 1;
    unique->cacheSlack = - (int) (unique->cacheSlots + 1);
    for (i = 0; i < unique->size; i++) {
        unique->subtables[i].maxKeys <<= 2;
    }
    unique->gcFrac = DD_GC_FRAC_MIN;
    unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
    cuddShrinkDeathRow(unique);
    (void) fprintf(unique->err,"Slowing down table growth: ");
    (void) fprintf(unique->err,"GC fraction = %.2f\t", unique->gcFrac);
    (void) fprintf(unique->err,"minDead = %u\n", unique->minDead);

}